

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AddPrimaryKey(Parse *pParse,ExprList *pList,int onError,int autoInc,int sortOrder)

{
  u8 *puVar1;
  short sVar2;
  Table *pTVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Expr *pEVar7;
  ExprList_item *pEVar8;
  size_t sVar9;
  Expr *pEVar10;
  Column *pCVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  Column *local_60;
  
  pTVar3 = pParse->pNewTable;
  if (pTVar3 == (Table *)0x0) goto LAB_0014ddcf;
  if ((pTVar3->tabFlags & 4) != 0) {
    sqlite3ErrorMsg(pParse,"table \"%s\" has more than one primary key",pTVar3->zName);
    goto LAB_0014ddcf;
  }
  uVar4 = pTVar3->tabFlags | 4;
  pTVar3->tabFlags = uVar4;
  if (pList == (ExprList *)0x0) {
    lVar13 = (long)pTVar3->nCol + -1;
    local_60 = pTVar3->aCol + lVar13;
    puVar1 = &pTVar3->aCol[lVar13].colFlags;
    *puVar1 = *puVar1 | 1;
    bVar15 = true;
  }
  else {
    iVar6 = pList->nExpr;
    if ((long)iVar6 < 1) {
      bVar15 = false;
      lVar13 = 0xffffffff;
      local_60 = (Column *)0x0;
    }
    else {
      lVar13 = 0xffffffff;
      lVar14 = 0;
      local_60 = (Column *)0x0;
      do {
        pEVar7 = pList->a[lVar14].pExpr;
        while ((pEVar7 != (Expr *)0x0 && ((pEVar7->flags >> 0xc & 1) != 0))) {
          if ((pEVar7->flags >> 0x12 & 1) == 0) {
            pEVar8 = (ExprList_item *)&pEVar7->pLeft;
          }
          else {
            pEVar8 = ((pEVar7->x).pList)->a;
          }
          pEVar7 = pEVar8->pExpr;
        }
        pEVar10 = pEVar7;
        if ((pEVar7->op == 'a') ||
           ((pEVar7->op == '^' && (pEVar10 = pEVar7->pLeft, pEVar10->op == 'a')))) {
          pEVar10->op = '\x1b';
        }
        if (pEVar7->op == '\x1b') {
          sVar2 = pTVar3->nCol;
          if ((long)sVar2 < 1) {
            lVar13 = 0;
          }
          else {
            pcVar12 = (pEVar7->u).zToken;
            pCVar11 = pTVar3->aCol;
            lVar13 = 0;
            do {
              iVar5 = sqlite3StrICmp(pcVar12,pCVar11->zName);
              if (iVar5 == 0) {
                pCVar11->colFlags = pCVar11->colFlags | 1;
                local_60 = pCVar11;
                break;
              }
              lVar13 = lVar13 + 1;
              pCVar11 = pCVar11 + 1;
            } while (sVar2 != lVar13);
          }
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != iVar6);
      bVar15 = iVar6 == 1;
    }
  }
  if ((bVar15) && (local_60 != (Column *)0x0)) {
    if ((local_60->colFlags & 4) == 0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = local_60->zName;
      sVar9 = strlen(pcVar12);
      pcVar12 = pcVar12 + sVar9 + 1;
    }
    iVar6 = sqlite3StrICmp(pcVar12,"INTEGER");
    if ((sortOrder == 1) || (iVar6 != 0)) goto LAB_0014dd82;
    pTVar3->iPKey = (i16)lVar13;
    pTVar3->keyConf = (u8)onError;
    pTVar3->tabFlags = uVar4 | autoInc << 3;
    if (pList != (ExprList *)0x0) {
      pParse->iPkSortOrder = pList->a[0].sortOrder;
      goto LAB_0014ddcf;
    }
  }
  else {
LAB_0014dd82:
    if (autoInc != 0) {
      sqlite3ErrorMsg(pParse,"AUTOINCREMENT is only allowed on an INTEGER PRIMARY KEY");
      goto LAB_0014ddcf;
    }
    sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,onError,(Token *)0x0,
                       (Expr *)0x0,sortOrder,0,'\x02');
  }
  pList = (ExprList *)0x0;
LAB_0014ddcf:
  if (pList == (ExprList *)0x0) {
    return;
  }
  exprListDeleteNN(pParse->db,pList);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddPrimaryKey(
  Parse *pParse,    /* Parsing context */
  ExprList *pList,  /* List of field names to be indexed */
  int onError,      /* What to do with a uniqueness conflict */
  int autoInc,      /* True if the AUTOINCREMENT keyword is present */
  int sortOrder     /* SQLITE_SO_ASC or SQLITE_SO_DESC */
){
  Table *pTab = pParse->pNewTable;
  Column *pCol = 0;
  int iCol = -1, i;
  int nTerm;
  if( pTab==0 ) goto primary_key_exit;
  if( pTab->tabFlags & TF_HasPrimaryKey ){
    sqlite3ErrorMsg(pParse, 
      "table \"%s\" has more than one primary key", pTab->zName);
    goto primary_key_exit;
  }
  pTab->tabFlags |= TF_HasPrimaryKey;
  if( pList==0 ){
    iCol = pTab->nCol - 1;
    pCol = &pTab->aCol[iCol];
    pCol->colFlags |= COLFLAG_PRIMKEY;
    nTerm = 1;
  }else{
    nTerm = pList->nExpr;
    for(i=0; i<nTerm; i++){
      Expr *pCExpr = sqlite3ExprSkipCollate(pList->a[i].pExpr);
      assert( pCExpr!=0 );
      sqlite3StringToId(pCExpr);
      if( pCExpr->op==TK_ID ){
        const char *zCName = pCExpr->u.zToken;
        for(iCol=0; iCol<pTab->nCol; iCol++){
          if( sqlite3StrICmp(zCName, pTab->aCol[iCol].zName)==0 ){
            pCol = &pTab->aCol[iCol];
            pCol->colFlags |= COLFLAG_PRIMKEY;
            break;
          }
        }
      }
    }
  }
  if( nTerm==1
   && pCol
   && sqlite3StrICmp(sqlite3ColumnType(pCol,""), "INTEGER")==0
   && sortOrder!=SQLITE_SO_DESC
  ){
    pTab->iPKey = iCol;
    pTab->keyConf = (u8)onError;
    assert( autoInc==0 || autoInc==1 );
    pTab->tabFlags |= autoInc*TF_Autoincrement;
    if( pList ) pParse->iPkSortOrder = pList->a[0].sortOrder;
  }else if( autoInc ){
#ifndef SQLITE_OMIT_AUTOINCREMENT
    sqlite3ErrorMsg(pParse, "AUTOINCREMENT is only allowed on an "
       "INTEGER PRIMARY KEY");
#endif
  }else{
    sqlite3CreateIndex(pParse, 0, 0, 0, pList, onError, 0,
                           0, sortOrder, 0, SQLITE_IDXTYPE_PRIMARYKEY);
    pList = 0;
  }

primary_key_exit:
  sqlite3ExprListDelete(pParse->db, pList);
  return;
}